

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle-vulkan.c
# Opt level: O1

void demo_prepare(demo *demo)

{
  uint32_t *puVar1;
  VkDescriptorSetLayout *ppVVar2;
  float fVar3;
  VkSampleCountFlagBits VVar4;
  VkPipelineDynamicStateCreateInfo *pVVar5;
  VkImage pVVar6;
  VkResult VVar7;
  VkPresentModeKHR *pVVar8;
  VkImage *ppVVar9;
  SwapchainBuffers *pSVar10;
  ulong uVar11;
  VkFramebuffer *ppVVar12;
  uint uVar13;
  uint32_t uVar14;
  long lVar15;
  undefined8 *puVar16;
  undefined8 *puVar17;
  ulong uVar18;
  long lVar19;
  bool bVar20;
  byte bVar21;
  VkImageViewCreateInfo view;
  VkSurfaceCapabilitiesKHR surfCapabilities;
  uint32_t presentModeCount;
  VkSwapchainCreateInfoKHR swapchain;
  VkAttachmentReference depth_reference;
  VkDynamicState dynamicStateEnables [9];
  VkPipelineDynamicStateCreateInfo dynamicState;
  VkPipelineInputAssemblyStateCreateInfo ia;
  VkPipelineViewportStateCreateInfo vp;
  VkPipelineVertexInputStateCreateInfo vi;
  VkCommandPoolCreateInfo cmd_pool_info;
  VkPipelineColorBlendAttachmentState att_state [1];
  VkCommandBufferAllocateInfo cmd;
  VkPipelineCacheCreateInfo pipelineCache;
  VkPipelineMultisampleStateCreateInfo ms;
  undefined1 local_3b8 [28];
  undefined4 uStack_39c;
  undefined8 local_398;
  undefined1 auStack_390 [8];
  undefined8 uStack_388;
  VkImageSubresourceRange VStack_380;
  undefined4 local_36c;
  undefined4 local_368;
  undefined4 uStack_364;
  undefined4 uStack_360;
  undefined4 uStack_35c;
  undefined8 local_358;
  VkDescriptorSetLayout *local_350;
  undefined1 local_348 [8];
  VkExtent2D VStack_340;
  VkExtent2D local_338;
  VkExtent2D VStack_330;
  char *local_328;
  VkSubpassDescription *pVStack_320;
  undefined8 local_318;
  VkSubpassDependency *pVStack_310;
  undefined8 local_308;
  VkShaderModule pVStack_300;
  char *local_2f8;
  undefined8 uStack_2f0;
  uint32_t *local_2e0;
  VkPipelineRasterizationStateCreateInfo local_2d8;
  undefined1 local_298 [16];
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  VkSampleCountFlagBits VStack_268;
  float fStack_264;
  undefined8 uStack_260;
  undefined8 uStack_258;
  VkPipelineMultisampleStateCreateInfo *local_250;
  undefined8 local_248;
  undefined8 uStack_240;
  VkPipelineDynamicStateCreateInfo *local_238;
  VkPipelineLayout local_230;
  VkRenderPass local_228;
  VkPipelineColorBlendStateCreateInfo local_208;
  VkDynamicState local_1c8 [12];
  VkPipelineDynamicStateCreateInfo local_198;
  VkPipelineInputAssemblyStateCreateInfo local_178;
  VkPipelineViewportStateCreateInfo local_158;
  VkPipelineVertexInputStateCreateInfo local_128;
  VkCommandPoolCreateInfo local_f0;
  VkPipelineColorBlendAttachmentState local_d8;
  VkCommandBufferAllocateInfo local_b8;
  VkPipelineCacheCreateInfo local_98;
  VkPipelineMultisampleStateCreateInfo local_68;
  
  bVar21 = 0;
  local_f0.sType = VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO;
  local_f0.pNext = (void *)0x0;
  local_f0.flags = 2;
  local_f0.queueFamilyIndex = demo->graphics_queue_node_index;
  VVar7 = (*glad_vkCreateCommandPool)
                    (demo->device,&local_f0,(VkAllocationCallbacks *)0x0,&demo->cmd_pool);
  if (VVar7 != VK_SUCCESS) {
    __assert_fail("!err",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/tests/triangle-vulkan.c"
                  ,0x5ac,"void demo_prepare(struct demo *)");
  }
  local_b8.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO;
  local_b8.pNext = (void *)0x0;
  local_b8.commandPool = demo->cmd_pool;
  local_b8.level = VK_COMMAND_BUFFER_LEVEL_PRIMARY;
  local_b8.commandBufferCount = 1;
  VVar7 = (*glad_vkAllocateCommandBuffers)(demo->device,&local_b8,&demo->draw_cmd);
  if (VVar7 != VK_SUCCESS) {
    __assert_fail("!err",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/tests/triangle-vulkan.c"
                  ,0x5b6,"void demo_prepare(struct demo *)");
  }
  pVVar5 = (VkPipelineDynamicStateCreateInfo *)demo->swapchain;
  VVar7 = (*glad_vkGetPhysicalDeviceSurfaceCapabilitiesKHR)
                    (demo->gpu,demo->surface,(VkSurfaceCapabilitiesKHR *)local_348);
  if (VVar7 != VK_SUCCESS) {
    __assert_fail("!err",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/tests/triangle-vulkan.c"
                  ,0x24b,"void demo_prepare_buffers(struct demo *)");
  }
  VVar7 = (*glad_vkGetPhysicalDeviceSurfacePresentModesKHR)
                    (demo->gpu,demo->surface,(uint32_t *)&local_2d8,(VkPresentModeKHR *)0x0);
  if (VVar7 != VK_SUCCESS) {
    __assert_fail("!err",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/tests/triangle-vulkan.c"
                  ,0x250,"void demo_prepare_buffers(struct demo *)");
  }
  pVVar8 = (VkPresentModeKHR *)malloc((local_2d8._0_8_ & 0xffffffff) << 2);
  if (pVVar8 == (VkPresentModeKHR *)0x0) {
    __assert_fail("presentModes",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/tests/triangle-vulkan.c"
                  ,0x253,"void demo_prepare_buffers(struct demo *)");
  }
  VVar7 = (*glad_vkGetPhysicalDeviceSurfacePresentModesKHR)
                    (demo->gpu,demo->surface,(uint32_t *)&local_2d8,pVVar8);
  if (VVar7 != VK_SUCCESS) {
    __assert_fail("!err",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/tests/triangle-vulkan.c"
                  ,0x256,"void demo_prepare_buffers(struct demo *)");
  }
  if ((float)VStack_340.width == -NAN) {
    fVar3 = (float)demo->width;
    VVar4 = demo->height;
    VStack_340.width = VStack_330.width;
    if ((uint)fVar3 < VStack_330.width) {
      VStack_340.width = (uint32_t)fVar3;
    }
    if ((uint)fVar3 < local_338.width) {
      VStack_340.width = local_338.width;
    }
    VStack_268 = local_338.height;
    if ((local_338.height <= VVar4) && (VStack_268 = VStack_330.height, VVar4 < VStack_330.height))
    {
      VStack_268 = VVar4;
    }
  }
  else {
    demo->width = VStack_340.width;
    demo->height = VStack_340.height;
    VStack_268 = VStack_340.height;
  }
  local_278._0_4_ = local_348._4_4_;
  if ((uint)local_348._0_4_ < (uint)local_348._4_4_) {
    local_278._0_4_ = local_348._0_4_;
  }
  if (local_348._4_4_ == VK_SAMPLER_ADDRESS_MODE_REPEAT) {
    local_278._0_4_ = local_348._0_4_;
  }
  local_248._0_4_ = VK_SURFACE_TRANSFORM_IDENTITY_BIT_KHR;
  if (((ulong)local_328 & 0x100000000) == 0) {
    local_248._0_4_ = (VkSurfaceTransformFlagBitsKHR)pVStack_320;
  }
  local_298._0_4_ = VK_STRUCTURE_TYPE_SWAPCHAIN_CREATE_INFO_KHR;
  local_298._8_8_ = (void *)0x0;
  local_288 = (VkDescriptorSet)((ulong)local_288._4_4_ << 0x20);
  uStack_280 = (VkPipelineShaderStageCreateInfo *)demo->surface;
  local_278._4_4_ = demo->format;
  uStack_270._0_4_ = demo->color_space;
  fStack_264 = 1.4013e-45;
  uStack_260._0_4_ = 0x10;
  uStack_260._4_4_ = VK_SHARING_MODE_EXCLUSIVE;
  uStack_258._0_4_ = 0.0;
  local_250 = (VkPipelineMultisampleStateCreateInfo *)0x0;
  local_248._4_4_ = VK_COMPOSITE_ALPHA_OPAQUE_BIT_KHR;
  uStack_240._0_4_ = VK_PRESENT_MODE_FIFO_KHR;
  uStack_240._4_4_ = 1;
  uStack_270._4_4_ = (float)VStack_340.width;
  local_238 = pVVar5;
  VVar7 = (*glad_vkCreateSwapchainKHR)
                    (demo->device,(VkSwapchainCreateInfoKHR *)local_298,(VkAllocationCallbacks *)0x0
                     ,&demo->swapchain);
  if (VVar7 != VK_SUCCESS) {
    __assert_fail("!err",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/tests/triangle-vulkan.c"
                  ,0x2a2,"void demo_prepare_buffers(struct demo *)");
  }
  if (pVVar5 != (VkPipelineDynamicStateCreateInfo *)0x0) {
    (*glad_vkDestroySwapchainKHR)(demo->device,(VkSwapchainKHR)pVVar5,(VkAllocationCallbacks *)0x0);
  }
  puVar1 = &demo->swapchainImageCount;
  VVar7 = (*glad_vkGetSwapchainImagesKHR)(demo->device,demo->swapchain,puVar1,(VkImage *)0x0);
  if (VVar7 != VK_SUCCESS) {
    __assert_fail("!err",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/tests/triangle-vulkan.c"
                  ,0x2ae,"void demo_prepare_buffers(struct demo *)");
  }
  ppVVar9 = (VkImage *)malloc((ulong)*puVar1 << 3);
  if (ppVVar9 == (VkImage *)0x0) {
    __assert_fail("swapchainImages",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/tests/triangle-vulkan.c"
                  ,0x2b2,"void demo_prepare_buffers(struct demo *)");
  }
  local_350 = (VkDescriptorSetLayout *)pVVar8;
  VVar7 = (*glad_vkGetSwapchainImagesKHR)(demo->device,demo->swapchain,puVar1,ppVVar9);
  if (VVar7 != VK_SUCCESS) {
    __assert_fail("!err",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/tests/triangle-vulkan.c"
                  ,0x2b6,"void demo_prepare_buffers(struct demo *)");
  }
  uVar13 = demo->swapchainImageCount;
  local_2e0 = puVar1;
  pSVar10 = (SwapchainBuffers *)malloc((ulong)uVar13 * 0x18);
  demo->buffers = pSVar10;
  if (pSVar10 == (SwapchainBuffers *)0x0) {
    __assert_fail("demo->buffers",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/tests/triangle-vulkan.c"
                  ,0x2ba,"void demo_prepare_buffers(struct demo *)");
  }
  if (uVar13 != 0) {
    lVar15 = 0x10;
    uVar18 = 0;
    do {
      local_3b8._0_4_ = VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO;
      local_3b8._8_8_ = (VkImage)0x0;
      local_3b8._16_4_ = VK_IMAGE_LAYOUT_UNDEFINED;
      local_398._0_4_ = VK_IMAGE_VIEW_TYPE_2D;
      local_398._4_4_ = demo->format;
      auStack_390._0_4_ = VK_COMPONENT_SWIZZLE_R;
      auStack_390._4_4_ = VK_COMPONENT_SWIZZLE_G;
      uStack_388._0_4_ = VK_COMPONENT_SWIZZLE_B;
      uStack_388._4_4_ = VK_COMPONENT_SWIZZLE_A;
      VStack_380.aspectMask = 1;
      VStack_380.baseMipLevel = 0;
      VStack_380.levelCount = 1;
      VStack_380.baseArrayLayer = 0;
      VStack_380.layerCount = 1;
      pVVar6 = ppVVar9[uVar18];
      pSVar10 = demo->buffers;
      *(VkImage *)((long)pSVar10 + lVar15 + -0x10) = pVVar6;
      local_3b8._24_4_ = SUB84(pVVar6,0);
      uStack_39c = (undefined4)((ulong)pVVar6 >> 0x20);
      VVar7 = (*glad_vkCreateImageView)
                        (demo->device,(VkImageViewCreateInfo *)local_3b8,
                         (VkAllocationCallbacks *)0x0,
                         (VkImageView *)((long)&pSVar10->image + lVar15));
      if (VVar7 != VK_SUCCESS) {
        __assert_fail("!err",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/tests/triangle-vulkan.c"
                      ,0x2d7,"void demo_prepare_buffers(struct demo *)");
      }
      uVar18 = uVar18 + 1;
      lVar15 = lVar15 + 0x18;
    } while (uVar18 < *local_2e0);
  }
  demo->current_buffer = 0;
  free(local_350);
  local_298._0_4_ = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
  local_298._8_8_ = (void *)0x0;
  local_288 = (VkDescriptorSet)0x100000000;
  uStack_280 = (VkPipelineShaderStageCreateInfo *)CONCAT44(demo->width,0x7c);
  local_278._0_4_ = demo->height;
  local_278._4_4_ = VK_SHARING_MODE_CONCURRENT;
  uStack_270._0_4_ = 1;
  uStack_270._4_4_ = 1.4013e-45;
  VStack_268 = VK_SAMPLE_COUNT_1_BIT;
  fStack_264 = 0.0;
  uStack_260._0_4_ = 0x20;
  uStack_260._4_4_ = VK_SHARING_MODE_EXCLUSIVE;
  uStack_258._0_4_ = 0.0;
  local_250 = (VkPipelineMultisampleStateCreateInfo *)0x0;
  local_248._0_4_ = 0;
  local_338.width = 0;
  local_338.height = 0;
  VStack_330.width = 0;
  VStack_330.height = 0;
  local_348 = (undefined1  [8])0x5;
  VStack_340.width = 0;
  VStack_340.height = 0;
  local_3b8._8_8_ = (VkImage)0x0;
  auStack_390._0_4_ = VK_COMPONENT_SWIZZLE_IDENTITY;
  auStack_390._4_4_ = VK_COMPONENT_SWIZZLE_IDENTITY;
  uStack_388._0_4_ = VK_COMPONENT_SWIZZLE_IDENTITY;
  uStack_388._4_4_ = VK_COMPONENT_SWIZZLE_IDENTITY;
  VStack_380.baseArrayLayer = 0;
  local_36c = 0;
  local_3b8._16_4_ = VK_IMAGE_LAYOUT_UNDEFINED;
  local_3b8._20_4_ = 0;
  local_3b8._24_4_ = 0;
  uStack_39c = 0;
  local_3b8._0_8_ = (VkSampler)0xf;
  local_398._0_4_ = VK_IMAGE_VIEW_TYPE_2D;
  local_398._4_4_ = VK_FORMAT_D16_UNORM;
  VStack_380.aspectMask = 2;
  VStack_380.baseMipLevel = 0;
  VStack_380.levelCount = 1;
  VStack_380.layerCount = 1;
  (demo->depth).format = VK_FORMAT_D16_UNORM;
  VVar7 = (*glad_vkCreateImage)
                    (demo->device,(VkImageCreateInfo *)local_298,(VkAllocationCallbacks *)0x0,
                     &(demo->depth).image);
  if (VVar7 != VK_SUCCESS) {
    __assert_fail("!err",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/tests/triangle-vulkan.c"
                  ,0x30c,"void demo_prepare_depth(struct demo *)");
  }
  (*glad_vkGetImageMemoryRequirements)
            (demo->device,(demo->depth).image,(VkMemoryRequirements *)&local_2d8);
  local_338.width = local_2d8.sType;
  local_338.height = local_2d8._4_4_;
  if ((local_2d8.flags & 1) == 0) {
    uVar18 = 0xffffffffffffffff;
    do {
      uVar11 = uVar18;
      if (uVar11 == 0x1e) goto LAB_0010f20f;
      uVar13 = local_2d8.flags & 2;
      uVar18 = uVar11 + 1;
      local_2d8.flags = local_2d8.flags >> 1;
    } while (uVar13 == 0);
    VStack_330.width = (int)uVar11 + 2;
    if (0x1e < uVar11 + 1) {
LAB_0010f20f:
      __assert_fail("pass",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/tests/triangle-vulkan.c"
                    ,0x316,"void demo_prepare_depth(struct demo *)");
    }
  }
  else {
    VStack_330 = (VkExtent2D)((ulong)VStack_330.height << 0x20);
  }
  VVar7 = (*glad_vkAllocateMemory)
                    (demo->device,(VkMemoryAllocateInfo *)local_348,(VkAllocationCallbacks *)0x0,
                     &(demo->depth).mem);
  if (VVar7 != VK_SUCCESS) {
    __assert_fail("!err",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/tests/triangle-vulkan.c"
                  ,0x31a,"void demo_prepare_depth(struct demo *)");
  }
  VVar7 = (*glad_vkBindImageMemory)(demo->device,(demo->depth).image,(demo->depth).mem,0);
  if (VVar7 != VK_SUCCESS) {
    __assert_fail("!err",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/tests/triangle-vulkan.c"
                  ,799,"void demo_prepare_depth(struct demo *)");
  }
  demo_set_image_layout
            (demo,(demo->depth).image,2,VK_IMAGE_LAYOUT_UNDEFINED,
             VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL,0);
  pVVar6 = (demo->depth).image;
  local_3b8._24_4_ = SUB84(pVVar6,0);
  uStack_39c = (undefined4)((ulong)pVVar6 >> 0x20);
  VVar7 = (*glad_vkCreateImageView)
                    (demo->device,(VkImageViewCreateInfo *)local_3b8,(VkAllocationCallbacks *)0x0,
                     &(demo->depth).view);
  if (VVar7 != VK_SUCCESS) {
    __assert_fail("!err",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/tests/triangle-vulkan.c"
                  ,0x329,"void demo_prepare_depth(struct demo *)");
  }
  local_2d8._0_8_ = &DAT_ff00ff00ffff0000;
  (*glad_vkGetPhysicalDeviceFormatProperties)
            (demo->gpu,VK_FORMAT_B8G8R8A8_UNORM,(VkFormatProperties *)local_348);
  if ((((ulong)local_348 & 1) == 0) || (demo->use_staging_buffer != false)) {
    if (((ulong)local_348 & 0x100000000) == 0) {
      __assert_fail("!\"No support for B8G8R8A8_UNORM as texture image format\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/tests/triangle-vulkan.c"
                    ,0x3d8,"void demo_prepare_textures(struct demo *)");
    }
    local_398._0_4_ = VK_IMAGE_VIEW_TYPE_1D;
    local_398._4_4_ = VK_FORMAT_UNDEFINED;
    auStack_390._0_4_ = VK_COMPONENT_SWIZZLE_IDENTITY;
    auStack_390._4_4_ = VK_COMPONENT_SWIZZLE_IDENTITY;
    local_3b8._16_4_ = VK_IMAGE_LAYOUT_UNDEFINED;
    local_3b8._20_4_ = 0;
    local_3b8._24_4_ = 0;
    uStack_39c = 0;
    local_3b8._0_8_ = (VkSampler)0x0;
    local_3b8._8_8_ = (VkImage)0x0;
    demo_prepare_texture_image
              (demo,(uint32_t *)&local_2d8,(texture_object *)local_3b8,VK_IMAGE_TILING_LINEAR,1,6);
    demo_prepare_texture_image
              (demo,(uint32_t *)&local_2d8,demo->textures,VK_IMAGE_TILING_OPTIMAL,6,1);
    demo_set_image_layout
              (demo,(VkImage)local_3b8._8_8_,1,local_3b8._16_4_,VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL
               ,0);
    demo_set_image_layout
              (demo,demo->textures[0].image,1,demo->textures[0].imageLayout,
               VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,0);
    local_298._0_8_ = 1;
    local_298._8_8_ = (void *)0x100000000;
    local_288 = (VkDescriptorSet)0x0;
    uStack_280 = (VkPipelineShaderStageCreateInfo *)0x100000000;
    local_278._0_4_ = VK_SAMPLER_ADDRESS_MODE_REPEAT;
    local_278._4_4_ = VK_SHARING_MODE_EXCLUSIVE;
    uStack_270._0_4_ = 1;
    uStack_270._4_4_ = 0.0;
    VStack_268 = 0;
    fStack_264 = 0.0;
    uStack_260._0_4_ = auStack_390._0_4_;
    uStack_260._4_4_ = auStack_390._4_4_;
    uStack_258._0_4_ = 1.4013e-45;
    (*glad_vkCmdCopyImage)
              (demo->setup_cmd,(VkImage)local_3b8._8_8_,VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
               demo->textures[0].image,VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,1,
               (VkImageCopy *)local_298);
    demo_set_image_layout
              (demo,demo->textures[0].image,1,VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
               demo->textures[0].imageLayout,0);
    demo_flush_init_cmd(demo);
    (*glad_vkDestroyImage)(demo->device,(VkImage)local_3b8._8_8_,(VkAllocationCallbacks *)0x0);
    (*glad_vkFreeMemory)
              (demo->device,(VkDeviceMemory)CONCAT44(uStack_39c,local_3b8._24_4_),
               (VkAllocationCallbacks *)0x0);
  }
  else {
    demo_prepare_texture_image
              (demo,(uint32_t *)&local_2d8,demo->textures,VK_IMAGE_TILING_LINEAR,4,6);
  }
  local_298._8_8_ = (void *)0x0;
  VStack_268 = 0;
  uStack_260._0_4_ = 0;
  uStack_260._4_4_ = VK_SHARING_MODE_EXCLUSIVE;
  uStack_258._0_4_ = 0.0;
  uStack_258._4_4_ = 0.0;
  local_278._0_4_ = VK_SAMPLER_ADDRESS_MODE_REPEAT;
  local_278._4_4_ = VK_SHARING_MODE_EXCLUSIVE;
  uStack_270._0_4_ = VK_COLORSPACE_SRGB_NONLINEAR_KHR;
  uStack_270._4_4_ = 0.0;
  local_288 = (VkDescriptorSet)0x0;
  uStack_280 = (VkPipelineShaderStageCreateInfo *)0x0;
  local_298._0_8_ = 0x1f;
  fStack_264 = 1.0;
  local_250 = (VkPipelineMultisampleStateCreateInfo *)0x4;
  lVar15 = 10;
  puVar16 = &DAT_00124ec0;
  puVar17 = (undefined8 *)local_3b8;
  while( true ) {
    if (lVar15 == 0) break;
    lVar15 = lVar15 + -1;
    *puVar17 = *puVar16;
    puVar16 = puVar16 + (ulong)bVar21 * -2 + 1;
    puVar17 = puVar17 + (ulong)bVar21 * -2 + 1;
  }
  VVar7 = (*glad_vkCreateSampler)
                    (demo->device,(VkSamplerCreateInfo *)local_298,(VkAllocationCallbacks *)0x0,
                     &demo->textures[0].sampler);
  if (VVar7 != VK_SUCCESS) {
    __assert_fail("!err",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/tests/triangle-vulkan.c"
                  ,0x3ff,"void demo_prepare_textures(struct demo *)");
  }
  pVVar6 = demo->textures[0].image;
  local_3b8._24_4_ = SUB84(pVVar6,0);
  uStack_39c = (undefined4)((ulong)pVVar6 >> 0x20);
  VVar7 = (*glad_vkCreateImageView)
                    (demo->device,(VkImageViewCreateInfo *)local_3b8,(VkAllocationCallbacks *)0x0,
                     &demo->textures[0].view);
  if (VVar7 != VK_SUCCESS) {
    __assert_fail("!err",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/tests/triangle-vulkan.c"
                  ,0x405,"void demo_prepare_textures(struct demo *)");
  }
  local_298._8_8_ = (void *)0x0;
  local_288 = (VkDescriptorSet)0x0;
  local_278._4_4_ = VK_SHARING_MODE_EXCLUSIVE;
  uStack_270._0_4_ = VK_COLORSPACE_SRGB_NONLINEAR_KHR;
  uStack_270._4_4_ = 0.0;
  VStack_268 = 0;
  fStack_264 = 0.0;
  local_298._0_4_ = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
  local_298._4_4_ = 0;
  uStack_280 = (VkPipelineShaderStageCreateInfo *)0x3c;
  local_278._0_4_ = 0x80;
  local_3b8._16_4_ = VK_IMAGE_LAYOUT_UNDEFINED;
  local_3b8._20_4_ = 0;
  local_3b8._24_4_ = 0;
  uStack_39c = 0;
  local_3b8._0_8_ = (VkSampler)0x5;
  local_3b8._8_8_ = (VkImage)0x0;
  (demo->vertices).vi_attrs[1].binding = 0;
  (demo->vertices).vi_attrs[1].format = VK_FORMAT_UNDEFINED;
  *(undefined8 *)&(demo->vertices).vi_attrs[1].offset = 0;
  (demo->vertices).vi_attrs[0].binding = 0;
  (demo->vertices).vi_attrs[0].format = VK_FORMAT_UNDEFINED;
  *(undefined8 *)&(demo->vertices).vi_attrs[0].offset = 0;
  (demo->vertices).vi_bindings[0].binding = 0;
  (demo->vertices).vi_bindings[0].stride = 0;
  *(undefined8 *)&(demo->vertices).vi_bindings[0].inputRate = 0;
  *(undefined8 *)&(demo->vertices).vi.vertexAttributeDescriptionCount = 0;
  (demo->vertices).vi.pVertexAttributeDescriptions = (VkVertexInputAttributeDescription *)0x0;
  (demo->vertices).vi.flags = 0;
  (demo->vertices).vi.vertexBindingDescriptionCount = 0;
  (demo->vertices).vi.pVertexBindingDescriptions = (VkVertexInputBindingDescription *)0x0;
  *(undefined8 *)&(demo->vertices).vi = 0;
  (demo->vertices).vi.pNext = (void *)0x0;
  (demo->vertices).buf = (VkBuffer)0x0;
  (demo->vertices).mem = (VkDeviceMemory)0x0;
  VVar7 = (*glad_vkCreateBuffer)
                    (demo->device,(VkBufferCreateInfo *)local_298,(VkAllocationCallbacks *)0x0,
                     &(demo->vertices).buf);
  if (VVar7 != VK_SUCCESS) {
    __assert_fail("!err",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/tests/triangle-vulkan.c"
                  ,0x427,"void demo_prepare_vertices(struct demo *)");
  }
  (*glad_vkGetBufferMemoryRequirements)
            (demo->device,(demo->vertices).buf,(VkMemoryRequirements *)local_348);
  local_3b8._16_4_ = local_348._0_4_;
  local_3b8._20_4_ = local_348._4_4_;
  bVar20 = true;
  uVar18 = 0;
  uVar14 = local_338.width;
  while (((uVar14 & 1) == 0 ||
         ((~(demo->memory_properties).memoryTypes[uVar18].propertyFlags & 6) != 0))) {
    uVar14 = uVar14 >> 1;
    bVar20 = uVar18 < 0x1f;
    uVar18 = uVar18 + 1;
    if (uVar18 == 0x20) {
LAB_0010f65d:
      if (!bVar20) {
        __assert_fail("pass",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/tests/triangle-vulkan.c"
                      ,0x431,"void demo_prepare_vertices(struct demo *)");
      }
      VVar7 = (*glad_vkAllocateMemory)
                        (demo->device,(VkMemoryAllocateInfo *)local_3b8,(VkAllocationCallbacks *)0x0
                         ,&(demo->vertices).mem);
      if (VVar7 != VK_SUCCESS) {
        __assert_fail("!err",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/tests/triangle-vulkan.c"
                      ,0x434,"void demo_prepare_vertices(struct demo *)");
      }
      VVar7 = (*glad_vkMapMemory)(demo->device,(demo->vertices).mem,0,
                                  CONCAT44(local_3b8._20_4_,local_3b8._16_4_),0,(void **)&local_2d8)
      ;
      if (VVar7 != VK_SUCCESS) {
        __assert_fail("!err",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/tests/triangle-vulkan.c"
                      ,0x438,"void demo_prepare_vertices(struct demo *)");
      }
      *(undefined8 *)(local_2d8._0_8_ + 0x2c) = 0x3f8000003f800000;
      *(undefined8 *)(local_2d8._0_8_ + 0x34) = 0x3f8000003f000000;
      *(undefined8 *)(local_2d8._0_8_ + 0x20) = 0x3f800000;
      *(undefined8 *)(local_2d8._0_8_ + 0x28) = 0x3f80000000000000;
      *(undefined8 *)(local_2d8._0_8_ + 0x10) = 0x3f80000000000000;
      *(undefined8 *)(local_2d8._0_8_ + 0x18) = 0x3e800000bf800000;
      *(undefined8 *)local_2d8._0_8_ = 0xbf800000bf800000;
      *(undefined8 *)(local_2d8._0_8_ + 8) = 0x3e800000;
      (*glad_vkUnmapMemory)(demo->device,(demo->vertices).mem);
      VVar7 = (*glad_vkBindBufferMemory)(demo->device,(demo->vertices).buf,(demo->vertices).mem,0);
      if (VVar7 != VK_SUCCESS) {
        __assert_fail("!err",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/tests/triangle-vulkan.c"
                      ,0x440,"void demo_prepare_vertices(struct demo *)");
      }
      (demo->vertices).vi.sType = VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO;
      (demo->vertices).vi.pNext = (void *)0x0;
      (demo->vertices).vi.vertexBindingDescriptionCount = 1;
      (demo->vertices).vi.pVertexBindingDescriptions = (demo->vertices).vi_bindings;
      (demo->vertices).vi.vertexAttributeDescriptionCount = 2;
      (demo->vertices).vi.pVertexAttributeDescriptions = (demo->vertices).vi_attrs;
      (demo->vertices).vi_bindings[0].binding = 0;
      (demo->vertices).vi_bindings[0].stride = 0x14;
      *(undefined8 *)&(demo->vertices).vi_bindings[0].inputRate = 0;
      (demo->vertices).vi_attrs[0].binding = 0;
      (demo->vertices).vi_attrs[0].format = VK_FORMAT_R32G32B32_SFLOAT;
      (demo->vertices).vi_attrs[0].offset = 0;
      (demo->vertices).vi_attrs[1].location = 1;
      (demo->vertices).vi_attrs[1].binding = 0;
      (demo->vertices).vi_attrs[1].format = VK_FORMAT_R32G32_SFLOAT;
      (demo->vertices).vi_attrs[1].offset = 0xc;
      local_338.width = 0;
      local_338.height = 0;
      local_348 = (undefined1  [8])0x100000000;
      VStack_340.width = 1;
      VStack_340.height = 0x10;
      local_3b8._0_4_ = VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_CREATE_INFO;
      local_3b8._8_8_ = (VkImage)0x0;
      local_3b8._16_4_ = VK_IMAGE_LAYOUT_UNDEFINED;
      local_3b8._20_4_ = 1;
      ppVVar2 = &demo->desc_layout;
      unique0x1000349d = (VkDescriptorSetLayoutBinding *)local_348;
      VVar7 = (*glad_vkCreateDescriptorSetLayout)
                        (demo->device,(VkDescriptorSetLayoutCreateInfo *)local_3b8,
                         (VkAllocationCallbacks *)0x0,ppVVar2);
      if (VVar7 != VK_SUCCESS) {
        __assert_fail("!err",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/tests/triangle-vulkan.c"
                      ,0x46b,"void demo_prepare_descriptor_layout(struct demo *)");
      }
      local_298._0_4_ = VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO;
      local_298._8_8_ = (void *)0x0;
      local_288 = (VkDescriptorSet)0x100000000;
      local_278._0_4_ = VK_SAMPLER_ADDRESS_MODE_REPEAT;
      uStack_270._0_4_ = VK_COLORSPACE_SRGB_NONLINEAR_KHR;
      uStack_270._4_4_ = 0.0;
      uStack_280 = (VkPipelineShaderStageCreateInfo *)ppVVar2;
      VVar7 = (*glad_vkCreatePipelineLayout)
                        (demo->device,(VkPipelineLayoutCreateInfo *)local_298,
                         (VkAllocationCallbacks *)0x0,&demo->pipeline_layout);
      if (VVar7 != VK_SUCCESS) {
        __assert_fail("!err",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/tests/triangle-vulkan.c"
                      ,0x476,"void demo_prepare_descriptor_layout(struct demo *)");
      }
      local_298._4_4_ = demo->format;
      local_298._0_4_ = VK_STRUCTURE_TYPE_APPLICATION_INFO;
      local_298._8_8_ = (void *)0x100000001;
      local_288 = (VkDescriptorSet)0x200000000;
      uStack_280 = (VkPipelineShaderStageCreateInfo *)0x200000001;
      local_278._0_4_ = VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_EDGE;
      local_278._4_4_ = VK_SHARING_MODE_EXCLUSIVE;
      uStack_270._0_4_ = (demo->depth).format;
      uStack_270._4_4_ = 1.4013e-45;
      VStack_268 = VK_SAMPLE_COUNT_1_BIT;
      fStack_264 = 1.4013e-45;
      uStack_260._0_4_ = 2;
      uStack_260._4_4_ = VK_SHARING_MODE_CONCURRENT;
      uStack_258._0_4_ = 4.2039e-45;
      uStack_258._4_4_ = 4.2039e-45;
      local_2d8.sType = 0;
      local_2d8._4_4_ = 2;
      uStack_388 = &local_208;
      local_208.sType = VK_STRUCTURE_TYPE_INSTANCE_CREATE_INFO;
      local_208._4_4_ = 3;
      local_3b8._0_8_ = (VkSampler)0x0;
      local_3b8._8_8_ = local_3b8._8_8_ & 0xffffffff00000000;
      local_3b8._16_4_ = VK_IMAGE_LAYOUT_UNDEFINED;
      local_3b8._20_4_ = 0;
      local_3b8._24_4_ = 1;
      local_398 = (VkExtent2D *)&local_2d8;
      auStack_390._0_4_ = VK_COMPONENT_SWIZZLE_IDENTITY;
      auStack_390._4_4_ = VK_COMPONENT_SWIZZLE_IDENTITY;
      VStack_380._0_8_ = VStack_380._0_8_ & 0xffffffff00000000;
      VStack_380.levelCount = 0;
      VStack_380.baseArrayLayer = 0;
      local_348._0_4_ = 0x26;
      VStack_340.width = 0;
      VStack_340.height = 0;
      local_338.width = 0;
      local_338.height = 2;
      local_328 = (char *)CONCAT44(local_328._4_4_,1);
      local_318 = (ulong)local_318._4_4_ << 0x20;
      pVStack_310 = (VkSubpassDependency *)0x0;
      local_350 = ppVVar2;
      VStack_330 = (VkExtent2D)local_298;
      pVStack_320 = (VkSubpassDescription *)local_3b8;
      VVar7 = (*glad_vkCreateRenderPass)
                        (demo->device,(VkRenderPassCreateInfo *)local_348,
                         (VkAllocationCallbacks *)0x0,&demo->render_pass);
      if (VVar7 != VK_SUCCESS) {
        __assert_fail("!err",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/tests/triangle-vulkan.c"
                      ,0x4b4,"void demo_prepare_render_pass(struct demo *)");
      }
      local_198.pDynamicStates = local_1c8;
      local_1c8[0] = VK_DYNAMIC_STATE_VIEWPORT;
      local_1c8[1] = VK_DYNAMIC_STATE_VIEWPORT;
      local_1c8[2] = VK_DYNAMIC_STATE_VIEWPORT;
      local_1c8[3] = VK_DYNAMIC_STATE_VIEWPORT;
      local_1c8[4] = VK_DYNAMIC_STATE_VIEWPORT;
      local_1c8[5] = VK_DYNAMIC_STATE_VIEWPORT;
      local_1c8[6] = VK_DYNAMIC_STATE_VIEWPORT;
      local_1c8[7] = VK_DYNAMIC_STATE_VIEWPORT;
      local_1c8[8] = 0;
      local_198.pNext = (void *)0x0;
      local_198.flags = 0;
      local_198.dynamicStateCount = 0;
      local_198.sType = VK_STRUCTURE_TYPE_PIPELINE_DYNAMIC_STATE_CREATE_INFO;
      local_198._4_4_ = 0;
      memset(local_298,0,0x90);
      local_298._0_4_ = VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO;
      local_230 = demo->pipeline_layout;
      local_128.sType = (demo->vertices).vi.sType;
      local_128._4_4_ = *(undefined4 *)&(demo->vertices).vi.field_0x4;
      local_128.pNext = (demo->vertices).vi.pNext;
      local_128.flags = (demo->vertices).vi.flags;
      local_128.vertexBindingDescriptionCount = (demo->vertices).vi.vertexBindingDescriptionCount;
      local_128.pVertexBindingDescriptions = (demo->vertices).vi.pVertexBindingDescriptions;
      local_128.vertexAttributeDescriptionCount =
           (demo->vertices).vi.vertexAttributeDescriptionCount;
      local_128._36_4_ = *(undefined4 *)&(demo->vertices).vi.field_0x24;
      local_128.pVertexAttributeDescriptions = (demo->vertices).vi.pVertexAttributeDescriptions;
      local_178.pNext = (void *)0x0;
      local_178.primitiveRestartEnable = 0;
      local_178._28_4_ = 0;
      local_178.sType = VK_STRUCTURE_TYPE_PIPELINE_INPUT_ASSEMBLY_STATE_CREATE_INFO;
      local_178._4_4_ = 0;
      local_178.flags = 0;
      local_178.topology = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST;
      local_2d8.pNext = (void *)0x0;
      local_2d8.flags = 0;
      local_2d8.depthBiasClamp = 0.0;
      local_2d8.depthBiasSlopeFactor = 0.0;
      local_2d8.sType = 0x17;
      local_2d8._4_4_ = 0;
      local_2d8.polygonMode = 0;
      local_2d8.cullMode = 2;
      local_2d8.frontFace = VK_FRONT_FACE_CLOCKWISE;
      local_2d8.depthClampEnable = 0;
      local_2d8.rasterizerDiscardEnable = 0;
      local_2d8.depthBiasEnable = 0;
      local_2d8.depthBiasConstantFactor = 0.0;
      local_2d8._56_8_ = 0x3f800000;
      local_208.blendConstants[2] = 0.0;
      local_208.blendConstants[3] = 0.0;
      local_208.blendConstants[0] = 0.0;
      local_208.blendConstants[1] = 0.0;
      local_208.flags = 0;
      local_208.logicOpEnable = 0;
      local_208.pNext = (void *)0x0;
      local_208.sType = VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_STATE_CREATE_INFO;
      local_208._4_4_ = 0;
      local_208.pAttachments = &local_d8;
      local_d8.srcAlphaBlendFactor = VK_BLEND_FACTOR_ZERO;
      local_d8.dstAlphaBlendFactor = VK_BLEND_FACTOR_ZERO;
      local_d8.dstColorBlendFactor = VK_BLEND_FACTOR_ZERO;
      local_d8.colorBlendOp = VK_BLEND_OP_ADD;
      local_d8.alphaBlendOp = VK_BLEND_OP_ADD;
      local_d8.colorWriteMask = 0xf;
      local_d8.blendEnable = 0;
      local_d8.srcColorBlendFactor = VK_BLEND_FACTOR_ZERO;
      local_208.logicOp = VK_LOGIC_OP_CLEAR;
      local_208.attachmentCount = 1;
      local_158._36_4_ = 0;
      local_158.pScissors = (VkRect2D *)0x0;
      local_158.pViewports = (VkViewport *)0x0;
      local_158.pNext = (void *)0x0;
      local_158.sType = VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_STATE_CREATE_INFO;
      local_158._4_4_ = 0;
      local_158.flags = 0;
      local_158.viewportCount = 1;
      uVar13 = local_198.dynamicStateCount + 1;
      local_1c8[local_198.dynamicStateCount] = VK_DYNAMIC_STATE_VIEWPORT;
      local_158.scissorCount = 1;
      local_198.dynamicStateCount = local_198.dynamicStateCount + 2;
      local_1c8[uVar13] = VK_DYNAMIC_STATE_SCISSOR;
      local_358 = 0;
      uStack_364 = 0;
      uStack_360 = 0;
      uStack_35c = 0;
      local_36c = 0;
      local_3b8._16_4_ = VK_IMAGE_LAYOUT_UNDEFINED;
      local_3b8._8_8_ = (VkImage)0x0;
      local_3b8._0_8_ = (VkSampler)0x19;
      local_3b8._20_4_ = 1;
      local_3b8._24_4_ = 1;
      uStack_39c = 3;
      local_398._0_4_ = VK_IMAGE_VIEW_TYPE_1D;
      VStack_380.baseArrayLayer = 0;
      VStack_380.layerCount = 0;
      local_368 = 7;
      local_398._4_4_ = VK_FORMAT_UNDEFINED;
      auStack_390._0_4_ = VK_COMPONENT_SWIZZLE_IDENTITY;
      auStack_390._4_4_ = VK_COMPONENT_SWIZZLE_IDENTITY;
      VStack_380.aspectMask = 0;
      VStack_380.baseMipLevel = 0;
      VStack_380.levelCount = 0;
      uStack_388._0_4_ = VK_COMPONENT_SWIZZLE_IDENTITY;
      uStack_388._4_4_ = VK_COMPONENT_SWIZZLE_A|VK_COMPONENT_SWIZZLE_ZERO;
      local_68.alphaToCoverageEnable = 0;
      local_68.alphaToOneEnable = 0;
      local_68.sampleShadingEnable = 0;
      local_68.minSampleShading = 0.0;
      local_68.pNext = (void *)0x0;
      local_68.sType = VK_STRUCTURE_TYPE_PIPELINE_MULTISAMPLE_STATE_CREATE_INFO;
      local_68._4_4_ = 0;
      local_68.pSampleMask = (VkSampleMask *)0x0;
      local_68.flags = 0;
      local_68.rasterizationSamples = VK_SAMPLE_COUNT_1_BIT;
      local_288 = (VkDescriptorSet)CONCAT44(2,(VkSwapchainCreateFlagsKHR)local_288);
      VStack_340.width = 0;
      VStack_340.height = 0;
      VStack_330.width = 0;
      VStack_330.height = 0;
      local_2f8 = (char *)0x0;
      uStack_2f0 = 0;
      local_308 = 0;
      pVStack_300 = (VkShaderModule)0x0;
      local_318._0_4_ = 0;
      local_318._4_4_ = 0;
      pVStack_310 = (VkSubpassDependency *)0x0;
      local_328 = (char *)0x0;
      pVStack_320 = (VkSubpassDescription *)0x0;
      local_348 = (undefined1  [8])0x12;
      local_338.width = 0;
      local_338.height = 1;
      VStack_330 = (VkExtent2D)demo_prepare_shader_module(demo,vertShaderCode,0x2f0);
      demo->vert_shader_module = (VkShaderModule)VStack_330;
      local_328 = "main";
      local_318._0_4_ = 0x12;
      local_308 = CONCAT44(0x10,(undefined4)local_308);
      pVStack_300 = demo_prepare_shader_module(demo,fragShaderCode,0x274);
      demo->frag_shader_module = pVStack_300;
      local_2f8 = "main";
      local_278 = (VkPipelineDepthStencilStateCreateInfo *)&local_128;
      uStack_270 = (VkDescriptorSetAllocateInfo *)&local_178;
      uStack_258 = &local_2d8;
      uStack_240 = &local_208;
      uStack_260 = &local_158;
      uStack_280 = (VkPipelineShaderStageCreateInfo *)local_348;
      local_228 = demo->render_pass;
      local_238 = &local_198;
      local_98.pNext = (void *)0x0;
      local_98.pInitialData = (void *)0x0;
      local_98.flags = 0;
      local_98._20_4_ = 0;
      local_98.initialDataSize = 0;
      local_98.sType = VK_STRUCTURE_TYPE_PIPELINE_CACHE_CREATE_INFO;
      local_98._4_4_ = 0;
      local_250 = &local_68;
      local_248 = (VkPipelineDepthStencilStateCreateInfo *)local_3b8;
      VVar7 = (*glad_vkCreatePipelineCache)
                        (demo->device,&local_98,(VkAllocationCallbacks *)0x0,&demo->pipelineCache);
      if (VVar7 != VK_SUCCESS) {
        __assert_fail("!err",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/tests/triangle-vulkan.c"
                      ,0x546,"void demo_prepare_pipeline(struct demo *)");
      }
      VVar7 = (*glad_vkCreateGraphicsPipelines)
                        (demo->device,demo->pipelineCache,1,
                         (VkGraphicsPipelineCreateInfo *)local_298,(VkAllocationCallbacks *)0x0,
                         &demo->pipeline);
      if (VVar7 != VK_SUCCESS) {
        __assert_fail("!err",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/tests/triangle-vulkan.c"
                      ,0x549,"void demo_prepare_pipeline(struct demo *)");
      }
      (*glad_vkDestroyPipelineCache)(demo->device,demo->pipelineCache,(VkAllocationCallbacks *)0x0);
      (*glad_vkDestroyShaderModule)
                (demo->device,demo->frag_shader_module,(VkAllocationCallbacks *)0x0);
      (*glad_vkDestroyShaderModule)
                (demo->device,demo->vert_shader_module,(VkAllocationCallbacks *)0x0);
      local_3b8._0_8_ = (VkSampler)0x100000001;
      local_298._0_4_ = VK_STRUCTURE_TYPE_DESCRIPTOR_POOL_CREATE_INFO;
      local_298._8_8_ = (void *)0x0;
      local_288 = (VkDescriptorSet)0x100000000;
      uStack_280 = (VkPipelineShaderStageCreateInfo *)CONCAT44(uStack_280._4_4_,1);
      local_278 = (VkPipelineDepthStencilStateCreateInfo *)local_3b8;
      VVar7 = (*glad_vkCreateDescriptorPool)
                        (demo->device,(VkDescriptorPoolCreateInfo *)local_298,
                         (VkAllocationCallbacks *)0x0,&demo->desc_pool);
      if (VVar7 != VK_SUCCESS) {
        __assert_fail("!err",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/tests/triangle-vulkan.c"
                      ,0x561,"void demo_prepare_descriptor_pool(struct demo *)");
      }
      local_3b8._0_4_ = VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO;
      local_3b8._8_8_ = (VkImage)0x0;
      local_3b8._16_4_ = SUB84(demo->desc_pool,0);
      local_3b8._20_4_ = (undefined4)((ulong)demo->desc_pool >> 0x20);
      local_3b8._24_4_ = 1;
      local_398._0_4_ = (VkImageViewType)local_350;
      local_398._4_4_ = (VkFormat)((ulong)local_350 >> 0x20);
      VVar7 = (*glad_vkAllocateDescriptorSets)
                        (demo->device,(VkDescriptorSetAllocateInfo *)local_3b8,&demo->desc_set);
      if (VVar7 != VK_SUCCESS) {
        __assert_fail("!err",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/tests/triangle-vulkan.c"
                      ,0x571,"void demo_prepare_descriptor_set(struct demo *)");
      }
      local_348 = (undefined1  [8])demo->textures[0].sampler;
      VStack_340 = (VkExtent2D)demo->textures[0].view;
      local_338.width = 1;
      local_338.height = 0;
      local_298._8_8_ = (void *)0x0;
      uStack_280 = (VkPipelineShaderStageCreateInfo *)0x0;
      VStack_268 = 0;
      fStack_264 = 0.0;
      uStack_260._0_4_ = 0;
      uStack_260._4_4_ = VK_SHARING_MODE_EXCLUSIVE;
      local_298._0_4_ = VK_STRUCTURE_TYPE_WRITE_DESCRIPTOR_SET;
      local_298._4_4_ = 0;
      local_288 = demo->desc_set;
      local_278._0_4_ = VK_SAMPLER_ADDRESS_MODE_MIRRORED_REPEAT;
      local_278._4_4_ = VK_SHARING_MODE_CONCURRENT;
      uStack_270 = (VkDescriptorSetAllocateInfo *)local_348;
      (*glad_vkUpdateDescriptorSets)
                (demo->device,1,(VkWriteDescriptorSet *)local_298,0,(VkCopyDescriptorSet *)0x0);
      local_3b8._8_8_ = (demo->depth).view;
      local_298._0_4_ = VK_STRUCTURE_TYPE_FRAMEBUFFER_CREATE_INFO;
      local_298._8_8_ = (void *)0x0;
      local_288 = (VkDescriptorSet)((ulong)local_288 & 0xffffffff00000000);
      uStack_280 = (VkPipelineShaderStageCreateInfo *)demo->render_pass;
      local_278._0_4_ = VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_EDGE;
      VStack_268 = demo->width;
      fStack_264 = (float)demo->height;
      uStack_260._0_4_ = 1;
      uVar13 = demo->swapchainImageCount;
      uStack_270 = (VkDescriptorSetAllocateInfo *)local_3b8;
      ppVVar12 = (VkFramebuffer *)malloc((ulong)uVar13 * 8);
      demo->framebuffers = ppVVar12;
      if (ppVVar12 == (VkFramebuffer *)0x0) {
        __assert_fail("demo->framebuffers",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/tests/triangle-vulkan.c"
                      ,0x597,"void demo_prepare_framebuffers(struct demo *)");
      }
      if (uVar13 != 0) {
        lVar19 = 2;
        lVar15 = 0;
        uVar18 = 0;
        do {
          local_3b8._0_8_ = (&demo->buffers->image)[lVar19];
          VVar7 = (*glad_vkCreateFramebuffer)
                            (demo->device,(VkFramebufferCreateInfo *)local_298,
                             (VkAllocationCallbacks *)0x0,
                             (VkFramebuffer *)((long)demo->framebuffers + lVar15));
          if (VVar7 != VK_SUCCESS) {
            __assert_fail("!err",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/tests/triangle-vulkan.c"
                          ,0x59d,"void demo_prepare_framebuffers(struct demo *)");
          }
          uVar18 = uVar18 + 1;
          lVar15 = lVar15 + 8;
          lVar19 = lVar19 + 3;
        } while (uVar18 < *local_2e0);
      }
      return;
    }
  }
  local_3b8._24_4_ = (undefined4)uVar18;
  goto LAB_0010f65d;
}

Assistant:

static void demo_prepare(struct demo *demo) {
    VkResult U_ASSERT_ONLY err;

    const VkCommandPoolCreateInfo cmd_pool_info = {
        .sType = VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO,
        .pNext = NULL,
        .queueFamilyIndex = demo->graphics_queue_node_index,
        .flags = VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT,
    };
    err = vkCreateCommandPool(demo->device, &cmd_pool_info, NULL,
                              &demo->cmd_pool);
    assert(!err);

    const VkCommandBufferAllocateInfo cmd = {
        .sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO,
        .pNext = NULL,
        .commandPool = demo->cmd_pool,
        .level = VK_COMMAND_BUFFER_LEVEL_PRIMARY,
        .commandBufferCount = 1,
    };
    err = vkAllocateCommandBuffers(demo->device, &cmd, &demo->draw_cmd);
    assert(!err);

    demo_prepare_buffers(demo);
    demo_prepare_depth(demo);
    demo_prepare_textures(demo);
    demo_prepare_vertices(demo);
    demo_prepare_descriptor_layout(demo);
    demo_prepare_render_pass(demo);
    demo_prepare_pipeline(demo);

    demo_prepare_descriptor_pool(demo);
    demo_prepare_descriptor_set(demo);

    demo_prepare_framebuffers(demo);
}